

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTimeConversion.cpp
# Opt level: O0

bool loopbackTicksToTime(longlong ticks,double rate)

{
  int iVar1;
  uint uVar2;
  longlong timeNs_00;
  longlong lVar3;
  undefined4 extraout_var;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  longlong outTicks;
  longlong timeNs;
  double in_stack_ffffffffffffffd8;
  longlong in_stack_ffffffffffffffe0;
  bool local_1;
  
  timeNs_00 = SoapySDR::ticksToTimeNs(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  lVar3 = SoapySDR::timeNsToTicks(timeNs_00,in_stack_ffffffffffffffd8);
  iVar1 = std::abs((int)in_RDI - (int)lVar3);
  local_1 = CONCAT44(extraout_var,iVar1) != 0;
  if (local_1) {
    printf("FAIL: loopbackTicksToTime(%lld, %f)\n",in_XMM0_Qa,in_RDI);
    printf("    timeNs = %lld, outTicks = %lld\n",timeNs_00,lVar3);
    uVar2 = std::abs((int)in_RDI - (int)lVar3);
    printf("    error = %d ticks\n",(ulong)uVar2);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

static bool loopbackTicksToTime(const long long ticks, const double rate)
{
    const long long timeNs = SoapySDR::ticksToTimeNs(ticks, rate);
    const long long outTicks = SoapySDR::timeNsToTicks(timeNs, rate);
    if (std::abs(ticks - outTicks) == 0) return true;
    printf("FAIL: loopbackTicksToTime(%lld, %f)\n", ticks, rate);
    printf("    timeNs = %lld, outTicks = %lld\n", timeNs, outTicks);
    printf("    error = %d ticks\n", int(std::abs(ticks - outTicks)));
    return false;
}